

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegen.cpp
# Opt level: O2

void MakeCmakeComment(string *cmakeComment,string *contents)

{
  long lVar1;
  ulong uVar2;
  
  std::__cxx11::string::reserve((ulong)cmakeComment);
  uVar2 = 0;
  while( true ) {
    lVar1 = std::__cxx11::string::find((char)contents,10);
    if (lVar1 == -1) break;
    std::__cxx11::string::append((char *)cmakeComment);
    std::__cxx11::string::append((string *)cmakeComment,(ulong)contents,uVar2);
    uVar2 = lVar1 + 1;
  }
  if (uVar2 < contents->_M_string_length) {
    std::__cxx11::string::append((char *)cmakeComment);
    std::__cxx11::string::append((string *)cmakeComment,(ulong)contents,uVar2);
    std::__cxx11::string::append((char *)cmakeComment);
    return;
  }
  return;
}

Assistant:

void MakeCmakeComment(std::string& cmakeComment, const std::string& contents)
{
    cmakeComment.reserve(contents.size());
    size_t lastPos = 0, findPos;
    while ((findPos = contents.find('\n', lastPos)) != std::string::npos) {
        cmakeComment.append("# ");
        cmakeComment.append(contents, lastPos, findPos - lastPos + 1);
        lastPos = findPos + 1;
    }
    if (lastPos < contents.size()) {
        cmakeComment.append("# ");
        cmakeComment.append(contents, lastPos, std::string::npos);
        cmakeComment.append("\n");
    }
}